

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryOpenGL.cpp
# Opt level: O3

void __thiscall
Diligent::EngineFactoryOpenGLImpl::CreateDeviceAndSwapChainGL
          (EngineFactoryOpenGLImpl *this,EngineGLCreateInfo *EngineCI,IRenderDevice **ppDevice,
          IDeviceContext **ppImmediateContext,SwapChainDesc *SCDesc,ISwapChain **ppSwapChain)

{
  long lVar1;
  IMemoryAllocator *CtorArgs;
  DeviceContextGLImpl *this_00;
  SwapChainGLImpl *this_01;
  DeviceContextGLImpl *pDeviceContextOpenGL;
  RenderDeviceGLImpl *pRenderDeviceOpenGL;
  string _msg;
  char (*in_stack_fffffffffffffc38) [2];
  DeviceContextGLImpl *local_3b8;
  RenderDeviceGLImpl *local_3b0;
  IMemoryAllocator *local_3a8;
  char local_3a0 [8];
  char *local_398;
  char *local_390;
  undefined4 local_388;
  DeviceContextDesc local_380;
  undefined1 local_368 [132];
  undefined8 local_2e4;
  undefined8 uStack_2dc;
  undefined8 local_2d4;
  undefined5 uStack_2cc;
  undefined3 uStack_2c7;
  undefined5 uStack_2c4;
  undefined8 uStack_2bf;
  undefined8 local_2b4;
  undefined8 uStack_2ac;
  undefined8 local_2a4;
  undefined8 uStack_29c;
  undefined8 local_294;
  undefined5 uStack_28c;
  undefined3 uStack_287;
  undefined5 uStack_284;
  undefined8 uStack_27f;
  WaveOpProperties local_274;
  BufferProperties local_264;
  TextureProperties TStack_25c;
  Bool local_23c;
  undefined2 local_23b;
  MeshShaderProperties local_238;
  undefined8 local_228;
  undefined7 uStack_220;
  undefined4 uStack_219;
  undefined4 local_214;
  SHADING_RATE_TEXTURE_ACCESS local_210;
  undefined8 local_20c;
  undefined8 uStack_204;
  undefined8 local_1fc;
  undefined1 auStack_1f4 [36];
  undefined8 local_1d0;
  Uint64 UStack_1c8;
  Uint64 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  DeviceFeatures aDStack_1a8 [7];
  Uint32 local_38;
  
  if (*(int *)EngineCI == 0x3e808) {
    if ((ppImmediateContext == (IDeviceContext **)0x0 || ppDevice == (IRenderDevice **)0x0) ||
        ppSwapChain == (ISwapChain **)0x0) {
      FormatString<char[22]>((string *)local_368,(char (*) [22])"Null pointer provided");
      DebugAssertionFailed
                ((Char *)local_368._0_8_,"CreateDeviceAndSwapChainGL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
                 ,0xd4);
    }
    else if (*(int *)(EngineCI + 0x1c) == 0) {
      if (*(uint *)(EngineCI + 0x18) < 2) {
        *ppDevice = (IRenderDevice *)0x0;
        *ppImmediateContext = (IDeviceContext *)0x0;
        *ppSwapChain = (ISwapChain *)0x0;
        local_23c = false;
        memset(local_368,0,0x82);
        local_2e4._0_4_ = 0;
        local_2e4._4_4_ = 0;
        uStack_2dc = 0;
        local_2d4 = 0;
        uStack_2cc = 0;
        uStack_2c7 = 0;
        uStack_2c4 = 0;
        uStack_2bf = 0;
        local_2b4._0_4_ = BIND_NONE;
        local_2b4._4_4_ = 0;
        uStack_2ac._0_4_ = 0;
        uStack_2ac._4_4_ = 0;
        local_2a4._0_4_ = 0;
        local_2a4._4_4_ = 0;
        uStack_29c._0_4_ = 0;
        uStack_29c._4_4_ = 0;
        local_294._0_4_ = 0;
        local_294._4_4_ = 0;
        uStack_28c = 0;
        uStack_287 = 0;
        uStack_284 = 0;
        uStack_27f = 0;
        local_274.MinSize = 0;
        local_274.MaxSize = 0;
        local_274.SupportedStages = SHADER_TYPE_UNKNOWN;
        local_274.Features = WAVE_FEATURE_UNKNOWN;
        local_264.ConstantBufferOffsetAlignment = 0;
        local_264.StructuredBufferOffsetAlignment = 0;
        TStack_25c.MaxTexture1DDimension = 0;
        TStack_25c.MaxTexture1DArraySlices = 0;
        TStack_25c.MaxTexture2DDimension = 0;
        TStack_25c.MaxTexture2DArraySlices = 0;
        TStack_25c._16_5_ = 0;
        TStack_25c.MaxTextureCubeDimension._1_3_ = 0;
        TStack_25c.Texture2DMSSupported = false;
        TStack_25c.Texture2DMSArraySupported = false;
        TStack_25c.TextureViewSupported = false;
        TStack_25c.CubemapArraysSupported = false;
        TStack_25c.TextureView2DOn3DSupported = false;
        local_23b._0_1_ = '\x01';
        local_23b._1_1_ = false;
        local_214._0_2_ = SHADING_RATE_CAP_FLAG_NONE;
        local_214._2_1_ = SHADING_RATE_COMBINER_PASSTHROUGH;
        local_214._3_1_ = SHADING_RATE_FORMAT_UNKNOWN;
        local_238.MaxThreadGroupCountX = 0;
        local_238.MaxThreadGroupCountY = 0;
        local_238.MaxThreadGroupCountZ = 0;
        local_238.MaxThreadGroupTotalCount = 0;
        local_228._0_1_ = SHADING_RATE_1X1;
        local_228._1_1_ = SAMPLE_COUNT_NONE;
        local_228._2_1_ = SHADING_RATE_1X1;
        local_228._3_1_ = SAMPLE_COUNT_NONE;
        local_228._4_1_ = SHADING_RATE_1X1;
        local_228._5_1_ = SAMPLE_COUNT_NONE;
        local_228._6_1_ = SHADING_RATE_1X1;
        local_228._7_1_ = SAMPLE_COUNT_NONE;
        uStack_220._0_1_ = SHADING_RATE_1X1;
        uStack_220._1_1_ = SAMPLE_COUNT_NONE;
        uStack_220._2_1_ = SHADING_RATE_1X1;
        uStack_220._3_1_ = SAMPLE_COUNT_NONE;
        uStack_220._4_1_ = SHADING_RATE_1X1;
        uStack_220._5_1_ = SAMPLE_COUNT_NONE;
        uStack_220._6_1_ = SHADING_RATE_1X1;
        uStack_219._0_1_ = SAMPLE_COUNT_NONE;
        uStack_219._1_1_ = SHADING_RATE_1X1;
        uStack_219._2_1_ = SAMPLE_COUNT_NONE;
        uStack_219._3_1_ = '\0';
        local_210 = SHADING_RATE_TEXTURE_ACCESS_UNKNOWN;
        auStack_1f4._24_2_ = 0;
        auStack_1f4._26_8_ = 0;
        auStack_1f4._8_4_ = 0;
        auStack_1f4._12_4_ = 0;
        auStack_1f4._16_2_ = 0;
        auStack_1f4._18_6_ = 0;
        local_1fc._0_4_ = 0;
        local_1fc._4_4_ = 0;
        auStack_1f4._0_4_ = 0;
        auStack_1f4._4_4_ = 0;
        local_20c._0_4_ = BIND_NONE;
        local_20c._4_4_ = 0;
        uStack_204._0_4_ = 0;
        uStack_204._4_4_ = 0;
        aDStack_1a8[0].SparseResources = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].SubpassFramebufferFetch = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TextureComponentSwizzle = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TextureSubresourceViews = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].NativeMultiDraw = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].AsyncShaderCompilation = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].FormattedBuffers = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TextureUAVExtendedFormats = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ShaderFloat16 = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ResourceBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].UniformBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ShaderInputOutput16 = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ShaderInt8 = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ResourceBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].WaveOp = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].NativeFence = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TileShaders = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].RayTracing = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].BindlessResources = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].OcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].BinaryOcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].PipelineStatisticsQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].DurationQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].DepthBiasClamp = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].DepthClamp = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].IndependentBlend = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].DualSourceBlend = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].MultiViewport = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TextureCompressionBC = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].TextureCompressionETC2 = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].VertexPipelineUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].PixelUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
        local_1b0._0_4_ = BIND_NONE;
        local_1b0._4_4_ = 0;
        aDStack_1a8[0].SeparablePrograms = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ShaderResourceQueries = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].WireframeFill = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].MultithreadedResourceCreation = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].ComputeShaders = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].GeometryShaders = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].Tessellation = DEVICE_FEATURE_STATE_DISABLED;
        aDStack_1a8[0].MeshShaders = DEVICE_FEATURE_STATE_DISABLED;
        local_1c0 = 0;
        uStack_1b8._0_4_ = SPARSE_RESOURCE_CAP_FLAG_NONE;
        uStack_1b8._4_4_ = 0;
        local_1d0._0_4_ = 0;
        local_1d0._4_4_ = 0;
        UStack_1c8 = 0;
        lVar1 = 0x1f8;
        do {
          *(undefined1 *)((long)local_380.TextureCopyGranularity + lVar1 + 4) = 0;
          *(undefined4 *)((long)local_380.TextureCopyGranularity + lVar1 + 8) = 0;
          *(undefined4 *)(local_368 + lVar1 + 8) = 0;
          *(undefined8 *)(local_368 + lVar1) = 0;
          lVar1 = lVar1 + 0x14;
        } while (lVar1 != 0x338);
        local_38 = 0;
        SetDefaultGraphicsAdapterInfo((GraphicsAdapterInfo *)local_368);
        VerifyEngineCreateInfo((EngineCreateInfo *)EngineCI,(GraphicsAdapterInfo *)local_368);
        SetRawAllocator(*(IMemoryAllocator **)(EngineCI + 0x58));
        CtorArgs = GetRawAllocator();
        if (EngineCI[0x91] == (EngineGLCreateInfo)0x3) {
          setenv("DRI_PRIME","1",1);
        }
        local_3a0[0] = '\0';
        local_3a0[1] = '\0';
        local_3a0[2] = '\0';
        local_3a0[3] = '\0';
        local_3a0[4] = '\0';
        local_3a0[5] = '\0';
        local_3a0[6] = '\0';
        local_3a0[7] = '\0';
        local_398 = "TRenderDeviceGLImpl instance";
        local_390 = 
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
        ;
        local_388 = 0xf3;
        local_3b8 = (DeviceContextGLImpl *)SCDesc;
        local_3a8 = CtorArgs;
        local_380.Name = (Char *)this;
        local_3b0 = MakeNewRCObj<Diligent::RenderDeviceGLImpl,Diligent::IMemoryAllocator>::
                    operator()((MakeNewRCObj<Diligent::RenderDeviceGLImpl,Diligent::IMemoryAllocator>
                                *)&local_3a8,CtorArgs,(EngineFactoryOpenGLImpl **)&local_380,
                               EngineCI,(SwapChainDesc **)&local_3b8);
        (**(local_3b0->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
           super_ObjectBase<Diligent::IRenderDeviceGL>.
           super_RefCountedObject<Diligent::IRenderDeviceGL>.super_IRenderDeviceGL.
           super_IRenderDevice.super_IObject._vptr_IObject)(local_3b0,IID_RenderDevice,ppDevice);
        local_3a0[0] = '\0';
        local_3a0[1] = '\0';
        local_3a0[2] = '\0';
        local_3a0[3] = '\0';
        local_3a0[4] = '\0';
        local_3a0[5] = '\0';
        local_3a0[6] = '\0';
        local_3a0[7] = '\0';
        local_398 = "DeviceContextGLImpl instance";
        local_390 = 
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
        ;
        local_388 = 0xfa;
        if (*(undefined8 **)(EngineCI + 0x10) == (undefined8 *)0x0) {
          local_380.Name = (Char *)0x0;
        }
        else {
          local_380.Name = (Char *)**(undefined8 **)(EngineCI + 0x10);
        }
        local_380.QueueType = COMMAND_QUEUE_TYPE_GRAPHICS;
        local_380.IsDeferred = false;
        local_380.ContextId = '\0';
        local_380.QueueId = '\0';
        local_380.TextureCopyGranularity[0] = 1;
        local_380.TextureCopyGranularity[1] = 1;
        local_380.TextureCopyGranularity[2] = 1;
        local_3a8 = CtorArgs;
        this_00 = MakeNewRCObj<Diligent::DeviceContextGLImpl,Diligent::IMemoryAllocator>::operator()
                            (&local_3a8,&local_3b0,&local_380);
        local_3b8 = this_00;
        DeviceContextGLImpl::QueryInterface
                  (this_00,(INTERFACE_ID *)IID_DeviceContext,(IObject **)ppImmediateContext);
        RenderDeviceBase<Diligent::EngineGLImplTraits>::SetImmediateContext
                  (&local_3b0->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,0,this_00);
        local_3a0[0] = '\0';
        local_3a0[1] = '\0';
        local_3a0[2] = '\0';
        local_3a0[3] = '\0';
        local_3a0[4] = '\0';
        local_3a0[5] = '\0';
        local_3a0[6] = '\0';
        local_3a0[7] = '\0';
        local_398 = "SwapChainGLImpl instance";
        local_390 = 
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
        ;
        local_388 = 0x109;
        local_3a8 = CtorArgs;
        this_01 = MakeNewRCObj<Diligent::SwapChainGLImpl,Diligent::IMemoryAllocator>::operator()
                            ((MakeNewRCObj<Diligent::SwapChainGLImpl,Diligent::IMemoryAllocator> *)
                             &local_3a8,EngineCI,SCDesc,&local_3b0,&local_3b8);
        SwapChainGLImpl::QueryInterface
                  (this_01,(INTERFACE_ID *)IID_SwapChain,(IObject **)ppSwapChain);
        DeviceContextGLImpl::SetSwapChain(local_3b8,(ISwapChainGL *)this_01);
        return;
      }
      FormatString<char[61]>
                ((string *)local_368,
                 (char (*) [61])"OpenGL back-end does not support multiple immediate contexts");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_368._0_8_,0,0,0);
      }
    }
    else {
      FormatString<char[51]>
                ((string *)local_368,
                 (char (*) [51])"OpenGL back-end does not support deferred contexts");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_368._0_8_,0,0,0);
      }
    }
  }
  else {
    local_3a8 = (IMemoryAllocator *)CONCAT44(local_3a8._4_4_,0x3e808);
    FormatString<char[26],int,char[50],int,char[2]>
              ((string *)local_368,(Diligent *)"Diligent Engine runtime (",(char (*) [26])&local_3a8
               ,(int *)") is not compatible with the client API version (",(char (*) [50])EngineCI,
               (int *)0x343766,in_stack_fffffffffffffc38);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_368._0_8_,0,0,0);
    }
  }
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
  }
  return;
}

Assistant:

void EngineFactoryOpenGLImpl::CreateDeviceAndSwapChainGL(const EngineGLCreateInfo& EngineCI,
                                                         IRenderDevice**           ppDevice,
                                                         IDeviceContext**          ppImmediateContext,
                                                         const SwapChainDesc&      SCDesc,
                                                         ISwapChain**              ppSwapChain)
{
    if (EngineCI.EngineAPIVersion != DILIGENT_API_VERSION)
    {
        LOG_ERROR_MESSAGE("Diligent Engine runtime (", DILIGENT_API_VERSION, ") is not compatible with the client API version (", EngineCI.EngineAPIVersion, ")");
        return;
    }

    VERIFY(ppDevice && ppImmediateContext && ppSwapChain, "Null pointer provided");
    if (!ppDevice || !ppImmediateContext || !ppSwapChain)
        return;

    if (EngineCI.NumDeferredContexts > 0)
    {
        LOG_ERROR_MESSAGE("OpenGL back-end does not support deferred contexts");
        return;
    }

    if (EngineCI.NumImmediateContexts > 1)
    {
        LOG_ERROR_MESSAGE("OpenGL back-end does not support multiple immediate contexts");
        return;
    }

    *ppDevice           = nullptr;
    *ppImmediateContext = nullptr;
    *ppSwapChain        = nullptr;

    try
    {
        GraphicsAdapterInfo AdapterInfo;
        SetDefaultGraphicsAdapterInfo(AdapterInfo);
        VerifyEngineCreateInfo(EngineCI, AdapterInfo);

        SetRawAllocator(EngineCI.pRawMemAllocator);
        IMemoryAllocator& RawMemAllocator = GetRawAllocator();

        SetPreferredAdapter(EngineCI);
        RenderDeviceGLImpl* pRenderDeviceOpenGL{
            NEW_RC_OBJ(RawMemAllocator, "TRenderDeviceGLImpl instance", TRenderDeviceGLImpl)(
                RawMemAllocator, this, EngineCI, &SCDesc //
                )                                        //
        };
        pRenderDeviceOpenGL->QueryInterface(IID_RenderDevice, reinterpret_cast<IObject**>(ppDevice));

        DeviceContextGLImpl* pDeviceContextOpenGL{
            NEW_RC_OBJ(RawMemAllocator, "DeviceContextGLImpl instance", DeviceContextGLImpl)(
                pRenderDeviceOpenGL,
                DeviceContextDesc{
                    EngineCI.pImmediateContextInfo ? EngineCI.pImmediateContextInfo[0].Name : nullptr,
                    COMMAND_QUEUE_TYPE_GRAPHICS,
                    False, // IsDeferred
                    0,     // Context id
                    0      // QueueId
                })         //
        };
        // We must call AddRef() (implicitly through QueryInterface()) because pRenderDeviceOpenGL will
        // keep a weak reference to the context
        pDeviceContextOpenGL->QueryInterface(IID_DeviceContext, reinterpret_cast<IObject**>(ppImmediateContext));
        pRenderDeviceOpenGL->SetImmediateContext(0, pDeviceContextOpenGL);

        TSwapChain* pSwapChainGL = NEW_RC_OBJ(RawMemAllocator, "SwapChainGLImpl instance", TSwapChain)(EngineCI, SCDesc, pRenderDeviceOpenGL, pDeviceContextOpenGL);
        pSwapChainGL->QueryInterface(IID_SwapChain, reinterpret_cast<IObject**>(ppSwapChain));

        pDeviceContextOpenGL->SetSwapChain(pSwapChainGL);
    }
    catch (const std::runtime_error&)
    {
        if (*ppDevice)
        {
            (*ppDevice)->Release();
            *ppDevice = nullptr;
        }

        if (*ppImmediateContext)
        {
            (*ppImmediateContext)->Release();
            *ppImmediateContext = nullptr;
        }

        if (*ppSwapChain)
        {
            (*ppSwapChain)->Release();
            *ppSwapChain = nullptr;
        }

        LOG_ERROR("Failed to initialize OpenGL-based render device");
    }
}